

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

void __thiscall QtFontStyle::~QtFontStyle(QtFontStyle *this)

{
  Data *pDVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  
  uVar2 = *(uint *)&this->field_0x4;
  while (3 < uVar2) {
    uVar2 = uVar2 - 4;
    *(uint *)&this->field_0x4 = uVar2;
    if (QGuiApplicationPrivate::platform_integration != (QPlatformIntegration *)0x0) {
      iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))
                ((long *)CONCAT44(extraout_var,iVar3),
                 this->pixelSizes[*(int *)&this->field_0x4 >> 2].handle);
      uVar2 = *(uint *)&this->field_0x4;
    }
  }
  free(this->pixelSizes);
  pDVar1 = (this->styleName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->styleName).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QtFontStyle::~QtFontStyle()
{
   while (count) {
       // bitfield count-- in while condition does not work correctly in mwccsym2
       count--;
       QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
       if (integration)
           integration->fontDatabase()->releaseHandle(pixelSizes[count].handle);
   }

   free(pixelSizes);
}